

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O2

bool suppressedById(char *id)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  char *__haystack;
  
  __haystack = eolComment;
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                  ,0x17b,"bool suppressedById(const char *)");
  }
  if (eolComment == (char *)0x0) {
    bVar4 = false;
  }
  else {
    sVar2 = strlen(id);
    __s2 = W_FAKE;
    if (sVar2 == 0) {
      __assert_fail("0 < idLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                    ,0x17e,"bool suppressedById(const char *)");
    }
    do {
      pcVar3 = strstr(__haystack,id);
      bVar4 = pcVar3 != (char *)0x0;
      if (pcVar3 == (char *)0x0) {
        return bVar4;
      }
      iVar1 = strcmp(id,__s2);
      if (iVar1 == 0) {
        return bVar4;
      }
      __haystack = pcVar3 + sVar2;
    } while (((pcVar3[sVar2] != '-') || (__haystack[1] != 'o')) || (__haystack[2] != 'k'));
  }
  return bVar4;
}

Assistant:

bool suppressedById(const char* id) {
	assert(id);
	if (nullptr == eolComment) return false;
	const size_t idLength = strlen(id);
	assert(0 < idLength);
	const char* commentToCheck = eolComment;
	while (const char* idPos = strstr(commentToCheck, id)) {
		if (!strcmp(id, W_FAKE)) return true;				// "fake" only is enough to suppress those
		commentToCheck = idPos + idLength;
		if ('-' == commentToCheck[0] && 'o' == commentToCheck[1] && 'k' == commentToCheck[2]) {
			return true;
		}
	}
	return false;
}